

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

string * cmExportFileGeneratorEscape(string *__return_storage_ptr__,string *str)

{
  string *extraout_RAX;
  
  cmOutputConverter::EscapeForCMake(__return_storage_ptr__,str);
  cmsys::SystemTools::ReplaceString
            (__return_storage_ptr__,"\\${_IMPORT_PREFIX}","${_IMPORT_PREFIX}");
  cmsys::SystemTools::ReplaceString
            (__return_storage_ptr__,"\\${CMAKE_IMPORT_LIBRARY_SUFFIX}",
             "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
  return extraout_RAX;
}

Assistant:

static std::string cmExportFileGeneratorEscape(std::string const& str)
{
  // Escape a property value for writing into a .cmake file.
  std::string result = cmOutputConverter::EscapeForCMake(str);
  // Un-escape variable references generated by our own export code.
  cmSystemTools::ReplaceString(result, "\\${_IMPORT_PREFIX}",
                               "${_IMPORT_PREFIX}");
  cmSystemTools::ReplaceString(result, "\\${CMAKE_IMPORT_LIBRARY_SUFFIX}",
                               "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
  return result;
}